

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O3

int TVMArrayCopyFromTo(TVMArrayHandle from,TVMArrayHandle to,TVMStreamHandle stream)

{
  tvm::runtime::NDArray::CopyFromTo(from,to,stream);
  return 0;
}

Assistant:

int TVMArrayCopyFromTo(TVMArrayHandle from,
                       TVMArrayHandle to,
                       TVMStreamHandle stream) {
  API_BEGIN();
  NDArray::CopyFromTo(from, to, stream);
  API_END();
}